

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O2

Hop_Obj_t * Hop_And(Hop_Man_t *p,Hop_Obj_t *p0,Hop_Obj_t *p1)

{
  Hop_Obj_t *pHVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pObj;
  Hop_Obj_t *pObj_00;
  
  pHVar3 = p0;
  if (p0 != p1) {
    if ((Hop_Obj_t *)((ulong)p1 ^ 1) == p0) {
      pHVar3 = (Hop_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pObj = (Hop_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
      pHVar1 = p->pConst1;
      if (pHVar1 == pObj) {
        pHVar3 = p1;
        if (pObj != p0) {
          pHVar3 = (Hop_Obj_t *)((ulong)p0 | 1);
        }
      }
      else {
        pObj_00 = (Hop_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
        if (pHVar1 == pObj_00) {
          if (pHVar1 != p1) {
            pHVar3 = (Hop_Obj_t *)((ulong)pHVar1 ^ 1);
          }
        }
        else {
          iVar2 = Hop_ObjIsConst1(pObj);
          if (iVar2 != 0) {
            __assert_fail("Type != AIG_AND || !Hop_ObjIsConst1(Hop_Regular(p0))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hop.h"
                          ,0xd3,
                          "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                         );
          }
          if (p1 == (Hop_Obj_t *)0x0) {
            pObj_00 = (Hop_Obj_t *)0x0;
          }
          else {
            iVar2 = Hop_ObjIsConst1(pObj_00);
            if (iVar2 != 0) {
              __assert_fail("p1 == NULL || !Hop_ObjIsConst1(Hop_Regular(p1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hop.h"
                            ,0xd4,
                            "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                           );
            }
          }
          if (pObj == pObj_00) {
            __assert_fail("Type == AIG_PI || Hop_Regular(p0) != Hop_Regular(p1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hop.h"
                          ,0xd5,
                          "Hop_Obj_t *Hop_ObjCreateGhost(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)"
                         );
          }
          *(uint *)&(p->Ghost).field_0x20 = *(uint *)&(p->Ghost).field_0x20 & 0xfffffff8 | 4;
          if (pObj->Id < pObj_00->Id) {
            pHVar3 = p1;
            p1 = p0;
          }
          (p->Ghost).pFanin0 = p1;
          (p->Ghost).pFanin1 = pHVar3;
          pHVar3 = Hop_TableLookup(p,&p->Ghost);
          if (pHVar3 == (Hop_Obj_t *)0x0) {
            pHVar3 = Hop_ObjCreate(p,&p->Ghost);
            return pHVar3;
          }
        }
      }
    }
  }
  return pHVar3;
}

Assistant:

Hop_Obj_t * Hop_And( Hop_Man_t * p, Hop_Obj_t * p0, Hop_Obj_t * p1 )
{
    Hop_Obj_t * pGhost, * pResult;
//    Hop_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Hop_Not(p1) )
        return Hop_Not(p->pConst1);
    if ( Hop_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Hop_Not(p->pConst1);
    if ( Hop_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Hop_Not(p->pConst1);
    // check if it can be an EXOR gate
//    if ( Hop_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
//        return Hop_Exor( p, pFan0, pFan1 );
    // check the table
    pGhost = Hop_ObjCreateGhost( p, p0, p1, AIG_AND );
    if ( (pResult = Hop_TableLookup( p, pGhost )) )
        return pResult;
    return Hop_ObjCreate( p, pGhost );
}